

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O2

string * __thiscall
OpenMD::DumpWriter::prepareDumpLine_abi_cxx11_
          (string *__return_storage_ptr__,DumpWriter *this,StuntDouble *sd)

{
  uint uVar1;
  string *psVar2;
  Quat4d q;
  Vector3d trq;
  Vector3d ji;
  Vector3d vel;
  Vector3d pos;
  string line;
  string type;
  char tempBuffer [4096];
  Vector<double,_4U> local_1108;
  Vector<double,_4U> local_10e8;
  Vector<double,_3U> local_10c8;
  Vector<double,_3U> local_10b0;
  Vector<double,_3U> local_1098;
  string *local_1080;
  undefined1 *local_1078;
  undefined8 local_1070;
  undefined1 local_1068 [16];
  undefined8 local_1058 [4];
  allocator<char> local_1038 [4104];
  
  uVar1 = sd->globalIntegrableObjectIndex_;
  local_1080 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1058,"pv",local_1038);
  local_1078 = local_1068;
  local_1070 = 0;
  local_1068[0] = 0;
  Vector<double,_3U>::Vector(&local_1098);
  Vector<double,_3U>::Vector(&local_10b0);
  StuntDouble::getPos((Vector3d *)&local_1108,sd);
  Vector<double,_3U>::operator=(&local_1098,(Vector<double,_3U> *)&local_1108);
  if (((0x7fefffffffffffff < (ulong)ABS(local_1098.data_[0])) ||
      (0x7fefffffffffffff < (ulong)ABS(local_1098.data_[1]))) ||
     (0x7fefffffffffffff < (ulong)ABS(local_1098.data_[2]))) {
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the position for object %d",(ulong)uVar1
            );
    painCave.isFatal = 1;
    simError();
  }
  StuntDouble::getVel((Vector3d *)&local_1108,sd);
  Vector<double,_3U>::operator=(&local_10b0,(Vector<double,_3U> *)&local_1108);
  if (((0x7fefffffffffffff < (ulong)ABS(local_10b0.data_[0])) ||
      (0x7fefffffffffffff < (ulong)ABS(local_10b0.data_[1]))) ||
     (0x7fefffffffffffff < (ulong)ABS(local_10b0.data_[2]))) {
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the velocity for object %d",(ulong)uVar1
            );
    painCave.isFatal = 1;
    simError();
  }
  snprintf((char *)local_1038,0x1000,"%18.10g %18.10g %18.10g %13e %13e %13e",local_1098.data_[0],
           local_1098.data_[1],local_1098.data_[2],local_10b0.data_[0],local_10b0.data_[1],
           local_10b0.data_[2]);
  std::__cxx11::string::append((char *)&local_1078);
  if (sd->objType_ - otDAtom < 2) {
    std::__cxx11::string::append((char *)local_1058);
    Vector<double,_4U>::Vector(&local_1108);
    Vector<double,_3U>::Vector(&local_10c8);
    StuntDouble::getQ((Quat4d *)&local_10e8,sd);
    Vector<double,_4U>::operator=(&local_1108,&local_10e8);
    if (((0x7fefffffffffffff < (ulong)ABS(local_1108.data_[0])) ||
        (0x7fefffffffffffff < (ulong)ABS(local_1108.data_[1]))) ||
       ((0x7fefffffffffffff < (ulong)ABS(local_1108.data_[2]) ||
        (0x7fefffffffffffff < (ulong)ABS(local_1108.data_[3]))))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the quaternion for object %d",
               (ulong)uVar1);
      painCave.isFatal = 1;
      simError();
    }
    StuntDouble::getJ((Vector3d *)&local_10e8,sd);
    Vector<double,_3U>::operator=(&local_10c8,(Vector<double,_3U> *)&local_10e8);
    if (((0x7fefffffffffffff < (ulong)ABS(local_10c8.data_[0])) ||
        (0x7fefffffffffffff < (ulong)ABS(local_10c8.data_[1]))) ||
       (0x7fefffffffffffff < (ulong)ABS(local_10c8.data_[2]))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the angular momentum for object %d",
               (ulong)uVar1);
      painCave.isFatal = 1;
      simError();
    }
    snprintf((char *)local_1038,0x1000," %13e %13e %13e %13e %13e %13e %13e",local_1108.data_[0],
             local_1108.data_[1],local_1108.data_[2],local_1108.data_[3],local_10c8.data_[0],
             local_10c8.data_[1],local_10c8.data_[2]);
    std::__cxx11::string::append((char *)&local_1078);
  }
  if (this->needForceVector_ == true) {
    std::__cxx11::string::append((char *)local_1058);
    StuntDouble::getFrc((Vector3d *)&local_1108,sd);
    if (((0x7fefffffffffffff < (ulong)ABS(local_1108.data_[0])) ||
        (0x7fefffffffffffff < (ulong)ABS(local_1108.data_[1]))) ||
       (0x7fefffffffffffff < (ulong)ABS(local_1108.data_[2]))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the force for object %d",(ulong)uVar1)
      ;
      painCave.isFatal = 1;
      simError();
    }
    snprintf((char *)local_1038,0x1000," %13e %13e %13e",local_1108.data_[0],local_1108.data_[1],
             local_1108.data_[2]);
    std::__cxx11::string::append((char *)&local_1078);
    if (sd->objType_ - otDAtom < 2) {
      std::__cxx11::string::append((char *)local_1058);
      StuntDouble::getTrq((Vector3d *)&local_10e8,sd);
      if (((0x7fefffffffffffff < (ulong)ABS(local_10e8.data_[0])) ||
          (0x7fefffffffffffff < (ulong)ABS(local_10e8.data_[1]))) ||
         (0x7fefffffffffffff < (ulong)ABS(local_10e8.data_[2]))) {
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the torque for object %d",
                 (ulong)uVar1);
        painCave.isFatal = 1;
        simError();
      }
      snprintf((char *)local_1038,0x1000," %13e %13e %13e",local_10e8.data_[0],local_10e8.data_[1],
               local_10e8.data_[2]);
      std::__cxx11::string::append((char *)&local_1078);
    }
  }
  snprintf((char *)local_1038,0x1000,"%10d %7s %s\n",(ulong)uVar1,local_1058[0],local_1078);
  psVar2 = local_1080;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1080,(char *)local_1038,(allocator<char> *)&local_1108);
  std::__cxx11::string::~string((string *)&local_1078);
  std::__cxx11::string::~string((string *)local_1058);
  return psVar2;
}

Assistant:

std::string DumpWriter::prepareDumpLine(StuntDouble* sd) {
    int index = sd->getGlobalIntegrableObjectIndex();
    std::string type("pv");
    std::string line;
    char tempBuffer[4096];

    Vector3d pos;
    Vector3d vel;
    pos = sd->getPos();

    if (std::isinf(pos[0]) || std::isnan(pos[0]) || std::isinf(pos[1]) ||
        std::isnan(pos[1]) || std::isinf(pos[2]) || std::isnan(pos[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the position"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    vel = sd->getVel();

    if (std::isinf(vel[0]) || std::isnan(vel[0]) || std::isinf(vel[1]) ||
        std::isnan(vel[1]) || std::isinf(vel[2]) || std::isnan(vel[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the velocity"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    snprintf(tempBuffer, 4096, "%18.10g %18.10g %18.10g %13e %13e %13e", pos[0],
             pos[1], pos[2], vel[0], vel[1], vel[2]);
    line += tempBuffer;

    if (sd->isDirectional()) {
      type += "qj";
      Quat4d q;
      Vector3d ji;
      q = sd->getQ();

      if (std::isinf(q[0]) || std::isnan(q[0]) || std::isinf(q[1]) ||
          std::isnan(q[1]) || std::isinf(q[2]) || std::isnan(q[2]) ||
          std::isinf(q[3]) || std::isnan(q[3])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the quaternion"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      ji = sd->getJ();

      if (std::isinf(ji[0]) || std::isnan(ji[0]) || std::isinf(ji[1]) ||
          std::isnan(ji[1]) || std::isinf(ji[2]) || std::isnan(ji[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the angular"
                 " momentum for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      snprintf(tempBuffer, 4096, " %13e %13e %13e %13e %13e %13e %13e", q[0],
               q[1], q[2], q[3], ji[0], ji[1], ji[2]);
      line += tempBuffer;
    }

    if (needForceVector_) {
      type += "f";
      Vector3d frc = sd->getFrc();
      if (std::isinf(frc[0]) || std::isnan(frc[0]) || std::isinf(frc[1]) ||
          std::isnan(frc[1]) || std::isinf(frc[2]) || std::isnan(frc[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the force"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(tempBuffer, 4096, " %13e %13e %13e", frc[0], frc[1], frc[2]);
      line += tempBuffer;

      if (sd->isDirectional()) {
        type += "t";
        Vector3d trq = sd->getTrq();
        if (std::isinf(trq[0]) || std::isnan(trq[0]) || std::isinf(trq[1]) ||
            std::isnan(trq[1]) || std::isinf(trq[2]) || std::isnan(trq[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the torque"
                   " for object %d",
                   index);
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", trq[0], trq[1], trq[2]);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%10d %7s %s\n", index, type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }